

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pp_red.c
# Opt level: O2

void ppRedTrinomial(word *a,pp_trinom_st *p)

{
  ulong *puVar1;
  ulong uVar2;
  ulong uVar3;
  byte bVar4;
  byte bVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  
  uVar2 = p->m;
  bVar4 = (byte)uVar2 & 0x3f;
  uVar10 = uVar2 >> 6;
  uVar6 = uVar2 - p->k;
  bVar5 = (byte)uVar6 & 0x3f;
  uVar7 = uVar6 >> 6;
  uVar2 = (uVar2 + 0x3f >> 6) * 2;
  while( true ) {
    uVar8 = uVar2 - 1;
    uVar3 = a[uVar8];
    if (uVar8 <= uVar10) break;
    a[(uVar2 - 2) - uVar10] = a[(uVar2 - 2) - uVar10] ^ uVar3 << (0x40 - bVar4 & 0x3f);
    a[uVar8 - uVar10] = a[uVar8 - uVar10] ^ uVar3 >> bVar4;
    uVar9 = uVar3 << (0x40 - bVar5 & 0x3f);
    if ((uVar6 & 0x3f) == 0) {
      uVar9 = 0;
    }
    a[(uVar2 - 2) - uVar7] = a[(uVar2 - 2) - uVar7] ^ uVar9;
    a[uVar8 - uVar7] = a[uVar8 - uVar7] ^ uVar3 >> bVar5;
    uVar2 = uVar8;
  }
  *a = *a ^ uVar3 >> bVar4;
  uVar10 = (uVar3 >> bVar4) << bVar4;
  if (((uVar6 & 0x3f) != 0) && (uVar7 < uVar8)) {
    a[(uVar2 - 2) - uVar7] = a[(uVar2 - 2) - uVar7] ^ uVar10 << (0x40 - bVar5 & 0x3f);
  }
  puVar1 = a + uVar8;
  puVar1[-uVar7] = puVar1[-uVar7] ^ uVar10 >> bVar5;
  *puVar1 = *puVar1 ^ uVar10;
  return;
}

Assistant:

void ppRedTrinomial(word a[], const pp_trinom_st* p)
{
	register word hi;
	size_t mb, mw, kb, kw;
	size_t n;
	// pre
	ASSERT(memIsValid(p, sizeof(pp_trinom_st)));
	ASSERT(wwIsValid(a, 2 * W_OF_B(p->m)));
	ASSERT(p->m % 8 != 0);
	ASSERT(p->m > p->k && p->k > 0);
	ASSERT(p->m - p->k >= B_PER_W);
	// разбор трехчлена
	mb = p->m % B_PER_W;
	mw = p->m / B_PER_W;
	kb = (p->m - p->k) % B_PER_W;
	kw = (p->m - p->k) / B_PER_W;
	// обработать старшие слова
	for (n = 2 * W_OF_B(p->m); --n > mw;)
	{
		hi = a[n];
		a[n - mw - 1] ^= hi << (B_PER_W - mb);
		a[n - mw] ^= hi >> mb;
		a[n - kw - 1] ^= kb ? hi << (B_PER_W - kb) : 0;
		a[n - kw] ^= hi >> kb;
	}
	// слово, на которое попадает моном x^m
	ASSERT(n == mw);
	hi = a[n] >> mb;
	a[0] ^= hi;
	hi <<= mb;
	if (kw < n && kb)
		a[n - kw - 1] ^= hi << (B_PER_W - kb);
	a[n - kw] ^= hi >> kb;
	a[n] ^= hi;
	// очистка
	hi = 0;
}